

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_file_system.cpp
# Opt level: O1

void __thiscall duckdb::ZstdStreamWrapper::Close(ZstdStreamWrapper *this)

{
  ZSTD_DStream *zds;
  
  if (this->zstd_compress_ptr != (ZSTD_CStream *)0x0 || this->zstd_stream_ptr != (ZSTD_DStream *)0x0
     ) {
    if (this->writing == true) {
      FlushStream(this);
    }
    zds = this->zstd_stream_ptr;
    if (zds != (ZSTD_DStream *)0x0) {
      duckdb_zstd::ZSTD_freeDStream(zds);
    }
    if (this->zstd_compress_ptr != (ZSTD_CStream *)0x0) {
      duckdb_zstd::ZSTD_freeCStream(this->zstd_compress_ptr);
    }
    this->zstd_stream_ptr = (ZSTD_DStream *)0x0;
    this->zstd_compress_ptr = (ZSTD_CStream *)0x0;
  }
  return;
}

Assistant:

void ZstdStreamWrapper::Close() {
	if (!zstd_stream_ptr && !zstd_compress_ptr) {
		return;
	}
	if (writing) {
		FlushStream();
	}
	if (zstd_stream_ptr) {
		duckdb_zstd::ZSTD_freeDStream(zstd_stream_ptr);
	}
	if (zstd_compress_ptr) {
		duckdb_zstd::ZSTD_freeCStream(zstd_compress_ptr);
	}
	zstd_stream_ptr = nullptr;
	zstd_compress_ptr = nullptr;
}